

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall
Catch::AssertionResultData::reconstructExpression_abi_cxx11_
          (string *__return_storage_ptr__,AssertionResultData *this)

{
  pointer pcVar1;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar2;
  size_t sVar3;
  ReusableStringStream rss;
  ReusableStringStream local_58;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (((this->reconstructedExpression)._M_string_length == 0) &&
     ((this->lazyExpression).m_transientExpression != (ITransientExpression *)0x0)) {
    local_58.super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_001a83e8
    ;
    pSVar2 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
             getInternal();
    sVar3 = StringStreams::add(&pSVar2->super_StringStreams);
    local_58.m_index = sVar3;
    pSVar2 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
             getInternal();
    local_58.m_oss =
         *(ostream **)
          &(pSVar2->super_StringStreams).m_streams.
           super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[sVar3]._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    operator<<(local_58.m_oss,&this->lazyExpression);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->reconstructedExpression,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
    ReusableStringStream::~ReusableStringStream(&local_58);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->reconstructedExpression)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->reconstructedExpression)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string AssertionResultData::reconstructExpression() const {

        if( reconstructedExpression.empty() ) {
            if( lazyExpression ) {
                ReusableStringStream rss;
                rss << lazyExpression;
                reconstructedExpression = rss.str();
            }
        }
        return reconstructedExpression;
    }